

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O0

int __thiscall Fl_Tree::open(Fl_Tree *this,char *__file,int __oflag,...)

{
  int iVar1;
  int __oflag_00;
  char *__file_00;
  int docallback_local;
  Fl_Tree_Item *item_local;
  Fl_Tree *this_local;
  
  __file_00 = __file;
  iVar1 = Fl_Tree_Item::is_open((Fl_Tree_Item *)__file);
  if (iVar1 == 0) {
    Fl_Tree_Item::open((Fl_Tree_Item *)__file,__file_00,__oflag_00);
    Fl_Widget::redraw((Fl_Widget *)this);
    if (__oflag != 0) {
      do_callback_for_item(this,(Fl_Tree_Item *)__file,FL_TREE_REASON_OPENED);
    }
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Tree::open(Fl_Tree_Item *item, int docallback) {
  if ( item->is_open() ) return(0);
  item->open();		// handles recalc_tree()
  redraw();
  if ( docallback ) {
    do_callback_for_item(item, FL_TREE_REASON_OPENED);
  }
  return(1);
}